

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

uint32 __thiscall
LinearScan::GeneratorBailIn::GetOffsetFromInterpreterStackFrame
          (GeneratorBailIn *this,RegSlot regSlot)

{
  RegSlot RVar1;
  uint32 uVar2;
  RegSlot regSlot_local;
  GeneratorBailIn *this_local;
  
  RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(this->jitFnBody);
  if (regSlot == RVar1) {
    this_local._4_4_ = Js::InterpreterStackFrame::GetOffsetOfLocalFrameDisplay();
  }
  else {
    RVar1 = JITTimeFunctionBody::GetLocalClosureReg(this->jitFnBody);
    if (regSlot == RVar1) {
      this_local._4_4_ = Js::InterpreterStackFrame::GetOffsetOfLocalClosure();
    }
    else {
      RVar1 = JITTimeFunctionBody::GetParamClosureReg(this->jitFnBody);
      if (regSlot == RVar1) {
        this_local._4_4_ = Js::InterpreterStackFrame::GetOffsetOfParamClosure();
      }
      else {
        uVar2 = Js::InterpreterStackFrame::GetOffsetOfLocals();
        this_local._4_4_ = regSlot * 8 + uVar2;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 LinearScan::GeneratorBailIn::GetOffsetFromInterpreterStackFrame(Js::RegSlot regSlot) const
{
    // Some objects aren't stored in the local space in interpreter frame, but instead
    // in their own fields. Use their offsets in such cases.
    if (regSlot == this->jitFnBody->GetLocalFrameDisplayReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfLocalFrameDisplay();
    }
    else if (regSlot == this->jitFnBody->GetLocalClosureReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfLocalClosure();
    }
    else if (regSlot == this->jitFnBody->GetParamClosureReg())
    {
        return Js::InterpreterStackFrame::GetOffsetOfParamClosure();
    }
    else
    {
        return regSlot * sizeof(Js::Var) + Js::InterpreterStackFrame::GetOffsetOfLocals();
    }
}